

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O1

double deRoundEven(double a)

{
  double dVar1;
  double integer;
  double local_8;
  
  dVar1 = modf(a,&local_8);
  if ((ABS(dVar1) == 0.5) && (!NAN(ABS(dVar1)))) {
    dVar1 = floor(a * 0.5 + 0.5);
    return dVar1 + dVar1;
  }
  dVar1 = floor(a + 0.5);
  return dVar1;
}

Assistant:

double deRoundEven (double a)
{
	double integer;
	double fract = modf(a, &integer);
	if (fabs(fract) == 0.5)
		return 2.0 * deRound(a / 2.0);
	return deRound(a);
}